

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType
          (UniformType *this,UniformStructCounter *structCounter,
          vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
          *_childTypes,int _arraySize)

{
  GLint GVar1;
  ostream *this_00;
  string local_1d0 [32];
  undefined1 local_1b0 [8];
  ostringstream _str;
  int _arraySize_local;
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  *_childTypes_local;
  UniformStructCounter *structCounter_local;
  UniformType *this_local;
  
  this->enumType = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->arraySizesSegmented);
  this->arraySize = _arraySize;
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector(&this->childTypes,_childTypes);
  std::__cxx11::string::string((string *)&this->strType);
  std::__cxx11::string::string((string *)&this->refStrType);
  std::pair<int,_int>::pair<int,_int,_true>(&this->size);
  this->isArray = 0 < _arraySize;
  this->signedType = true;
  this->baseType = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  this_00 = std::operator<<((ostream *)local_1b0,"S");
  GVar1 = UniformStructCounter::getNextCount(structCounter);
  std::ostream::operator<<(this_00,GVar1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->strType,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  if (this->arraySize == 0) {
    this->arraySize = 1;
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->arraySizesSegmented,&this->arraySize);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return;
}

Assistant:

UniformType(UniformStructCounter& structCounter, std::vector<UniformType> _childTypes, int _arraySize = 0)
		: enumType(0), arraySize(_arraySize), childTypes(_childTypes), isArray(_arraySize > 0), signedType(true)
	{
		baseType = 0;
		std::ostringstream _str;
		_str << "S" << structCounter.getNextCount();
		strType = _str.str();
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
	}